

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

int N_VScaleAddMulti_Serial(int nvec,realtype *a,N_Vector x,N_Vector *Y,N_Vector *Z)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (0 < nvec) {
    if (nvec == 1) {
      N_VLinearSum_Serial(*a,x,1.0,*Y,*Z);
    }
    else {
      uVar1 = *x->content;
      lVar2 = *(long *)((long)x->content + 8);
      uVar5 = 0;
      if (0 < (int)uVar1) {
        uVar5 = (ulong)uVar1;
      }
      if (Y == Z) {
        for (uVar6 = 0; uVar6 != (uint)nvec; uVar6 = uVar6 + 1) {
          lVar3 = *(long *)((long)Y[uVar6]->content + 8);
          for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
            *(double *)(lVar3 + uVar7 * 8) =
                 a[uVar6] * *(double *)(lVar2 + uVar7 * 8) + *(double *)(lVar3 + uVar7 * 8);
          }
        }
      }
      else {
        for (uVar6 = 0; uVar6 != (uint)nvec; uVar6 = uVar6 + 1) {
          lVar3 = *(long *)((long)Y[uVar6]->content + 8);
          lVar4 = *(long *)((long)Z[uVar6]->content + 8);
          for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
            *(double *)(lVar4 + uVar7 * 8) =
                 a[uVar6] * *(double *)(lVar2 + uVar7 * 8) + *(double *)(lVar3 + uVar7 * 8);
          }
        }
      }
    }
    return 0;
  }
  return -1;
}

Assistant:

int N_VScaleAddMulti_Serial(int nvec, realtype* a, N_Vector x, N_Vector* Y, N_Vector* Z)
{
  int          i;
  sunindextype j, N;
  realtype*    xd=NULL;
  realtype*    yd=NULL;
  realtype*    zd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VLinearSum */
  if (nvec == 1) {
    N_VLinearSum_Serial(a[0], x, ONE, Y[0], Z[0]);
    return(0);
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  /*
   * Y[i][j] += a[i] * x[j]
   */
  if (Y == Z) {
    for (i=0; i<nvec; i++) {
      yd = NV_DATA_S(Y[i]);
      for (j=0; j<N; j++) {
        yd[j] += a[i] * xd[j];
      }
    }
    return(0);
  }

  /*
   * Z[i][j] = Y[i][j] + a[i] * x[j]
   */
  for (i=0; i<nvec; i++) {
    yd = NV_DATA_S(Y[i]);
    zd = NV_DATA_S(Z[i]);
    for (j=0; j<N; j++) {
      zd[j] = a[i] * xd[j] + yd[j];
    }
  }
  return(0);
}